

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32 tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Limit limit;
  undefined4 extraout_var;
  UnknownFieldSet *pUVar5;
  undefined4 extraout_var_00;
  MessageLite *pMVar6;
  undefined4 extraout_var_01;
  EnumDescriptor *pEVar7;
  EnumValueDescriptor *pEVar8;
  ulong uVar9;
  long lVar10;
  uint64 value_00;
  long lVar11;
  long lVar12;
  double value;
  uint32 length;
  string local_58;
  Limit local_38;
  uint32 local_34;
  long *plVar4;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  if (field == (FieldDescriptor *)0x0) {
LAB_003343c7:
    pUVar5 = (UnknownFieldSet *)(**(code **)(*plVar4 + 0x18))(plVar4,message);
    bVar1 = SkipField(input,tag,pUVar5);
    return bVar1;
  }
  TVar3 = FieldDescriptor::type(field);
  if ((tag & 7) != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4)) {
    bVar1 = FieldDescriptor::is_packable(field);
    if ((tag & 7) == 2 && bVar1) {
      bVar1 = io::CodedInputStream::ReadVarint32(input,&local_34);
      if (!bVar1) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_34);
      TVar3 = FieldDescriptor::type(field);
      switch(TVar3) {
      case TYPE_DOUBLE:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                            (input,(double *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x230))(local_58._M_dataplus._M_p,plVar4,message,field);
        }
        break;
      case TYPE_FLOAT:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                            (input,(float *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x228))
                    ((ulong)local_58._M_dataplus._M_p & 0xffffffff,plVar4,message,field);
        }
        break;
      case TYPE_INT64:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (input,(int64 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x210))(plVar4,message,field,local_58._M_dataplus._M_p);
        }
        break;
      case TYPE_UINT64:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x220))(plVar4,message,field,local_58._M_dataplus._M_p);
        }
        break;
      case TYPE_INT32:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                            (input,(int32 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x208))
                    (plVar4,message,field,(ulong)local_58._M_dataplus._M_p & 0xffffffff);
        }
        break;
      case TYPE_FIXED64:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x220))(plVar4,message,field,local_58._M_dataplus._M_p);
        }
        break;
      case TYPE_FIXED32:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x218))
                    (plVar4,message,field,(ulong)local_58._M_dataplus._M_p & 0xffffffff);
        }
        break;
      case TYPE_BOOL:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,(bool *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x238))
                    (plVar4,message,field,(ulong)local_58._M_dataplus._M_p & 0xff);
        }
        break;
      case TYPE_STRING:
      case TYPE_GROUP:
      case TYPE_MESSAGE:
      case TYPE_BYTES:
        return false;
      case TYPE_UINT32:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x218))
                    (plVar4,message,field,(ulong)local_58._M_dataplus._M_p & 0xffffffff);
        }
        break;
      case TYPE_ENUM:
        local_38 = limit;
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                            (input,(int *)&local_58);
          if (!bVar1) {
            return false;
          }
          iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
          if (*(int *)(*(long *)(CONCAT44(extraout_var_01,iVar2) + 0x10) + 0x8c) == 3) {
            (**(code **)(*plVar4 + 0x250))
                      (plVar4,message,field,(ulong)local_58._M_dataplus._M_p & 0xffffffff);
          }
          else {
            pEVar7 = FieldDescriptor::enum_type(field);
            pEVar8 = EnumDescriptor::FindValueByNumber(pEVar7,(int)local_58._M_dataplus._M_p);
            if (pEVar8 == (EnumValueDescriptor *)0x0) {
              value_00 = (uint64)(int)local_58._M_dataplus._M_p;
              pUVar5 = (UnknownFieldSet *)(**(code **)(*plVar4 + 0x18))(plVar4,message);
              limit = local_38;
              UnknownFieldSet::AddVarint(pUVar5,tag >> 3,value_00);
            }
            else {
              (**(code **)(*plVar4 + 0x248))(plVar4,message,field,pEVar8);
            }
          }
        }
        break;
      case TYPE_SFIXED32:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                            (input,(int32 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x208))
                    (plVar4,message,field,(ulong)local_58._M_dataplus._M_p & 0xffffffff);
        }
        break;
      case TYPE_SFIXED64:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                            (input,(int64 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x210))(plVar4,message,field,local_58._M_dataplus._M_p);
        }
        break;
      case TYPE_SINT32:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                            (input,(int32 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x208))
                    (plVar4,message,field,(ulong)local_58._M_dataplus._M_p & 0xffffffff);
        }
        break;
      case MAX_TYPE:
        while (iVar2 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar2) {
          bVar1 = WireFormatLite::
                  ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                            (input,(int64 *)&local_58);
          if (!bVar1) {
            return false;
          }
          (**(code **)(*plVar4 + 0x210))(plVar4,message,field,local_58._M_dataplus._M_p);
        }
      }
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
    goto LAB_003343c7;
  }
  TVar3 = FieldDescriptor::type(field);
  switch(TVar3) {
  case TYPE_DOUBLE:
    bVar1 = WireFormatLite::
            ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      (input,(double *)&local_58);
    if (!bVar1) {
      return false;
    }
    iVar2 = *(int *)(field + 0x4c);
    lVar11 = *plVar4;
    lVar10 = 0x230;
    lVar12 = 0x110;
    goto LAB_0033455c;
  case TYPE_FLOAT:
    bVar1 = WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      (input,(float *)&local_58);
    if (!bVar1) {
      return false;
    }
    iVar2 = *(int *)(field + 0x4c);
    local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff;
    lVar11 = *plVar4;
    lVar10 = 0x228;
    lVar12 = 0x108;
LAB_0033455c:
    if (iVar2 == 3) {
      lVar12 = lVar10;
    }
    (**(code **)(lVar11 + lVar12))(local_58._M_dataplus._M_p,plVar4,message,field);
    return true;
  case TYPE_INT64:
    bVar1 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                      (input,(int64 *)&local_58);
    break;
  case TYPE_UINT64:
    bVar1 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_58);
    goto LAB_003345a8;
  case TYPE_INT32:
    bVar1 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (input,(int32 *)&local_58);
    goto LAB_00334463;
  case TYPE_FIXED64:
    bVar1 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&local_58);
LAB_003345a8:
    if (bVar1 == false) {
      return false;
    }
    iVar2 = *(int *)(field + 0x4c);
    lVar11 = *plVar4;
    lVar10 = 0x220;
    lVar12 = 0x100;
    goto LAB_003345c6;
  case TYPE_FIXED32:
    bVar1 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&local_58);
    goto LAB_0033463b;
  case TYPE_BOOL:
    bVar1 = WireFormatLite::
            ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                      (input,(bool *)&local_58);
    if (!bVar1) {
      return false;
    }
    bVar1 = *(int *)(field + 0x4c) == 3;
    uVar9 = (ulong)local_58._M_dataplus._M_p & 0xff;
    lVar11 = *plVar4;
    lVar10 = 0x238;
    lVar12 = 0x118;
    goto LAB_00334658;
  case TYPE_STRING:
    iVar2 = *(int *)(*(long *)(field + 0x30) + 0x8c);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    bVar1 = WireFormatLite::ReadBytes(input,&local_58);
    if (!bVar1) {
LAB_003346fb:
      std::__cxx11::string::~string((string *)&local_58);
      return false;
    }
    if (iVar2 == 3) {
      bVar1 = WireFormatLite::VerifyUtf8String
                        (local_58._M_dataplus._M_p,(int)local_58._M_string_length,PARSE,
                         (char *)**(undefined8 **)(field + 8));
      if (!bVar1) goto LAB_003346fb;
    }
    else {
      WireFormatLite::VerifyUtf8String
                (local_58._M_dataplus._M_p,(int)local_58._M_string_length,PARSE,
                 (char *)**(undefined8 **)(field + 8));
    }
    lVar11 = 0x120;
    if (*(int *)(field + 0x4c) == 3) {
      lVar11 = 0x240;
    }
    (**(code **)(*plVar4 + lVar11))(plVar4,message,field,&local_58);
    goto LAB_00334b0d;
  case TYPE_GROUP:
    lVar11 = 0x138;
    if (*(int *)(field + 0x4c) == 3) {
      lVar11 = 600;
    }
    pMVar6 = (MessageLite *)
             (**(code **)(*plVar4 + lVar11))(plVar4,message,field,input->extension_factory_);
    bVar1 = WireFormatLite::ReadGroup(tag >> 3,input,pMVar6);
    goto LAB_003346a1;
  case TYPE_MESSAGE:
    lVar11 = 0x138;
    if (*(int *)(field + 0x4c) == 3) {
      lVar11 = 600;
    }
    pMVar6 = (MessageLite *)
             (**(code **)(*plVar4 + lVar11))(plVar4,message,field,input->extension_factory_);
    bVar1 = WireFormatLite::ReadMessage(input,pMVar6);
LAB_003346a1:
    if (bVar1 != false) {
      return true;
    }
    return false;
  case TYPE_BYTES:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    bVar1 = WireFormatLite::ReadBytes(input,&local_58);
    if (!bVar1) goto LAB_003346fb;
    lVar11 = 0x120;
    if (*(int *)(field + 0x4c) == 3) {
      lVar11 = 0x240;
    }
    (**(code **)(*plVar4 + lVar11))(plVar4,message,field,&local_58);
LAB_00334b0d:
    std::__cxx11::string::~string((string *)&local_58);
    return true;
  case TYPE_UINT32:
    bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_58);
LAB_0033463b:
    if (bVar1 == false) {
      return false;
    }
    bVar1 = *(int *)(field + 0x4c) == 3;
    uVar9 = (ulong)local_58._M_dataplus._M_p & 0xffffffff;
    lVar11 = *plVar4;
    lVar10 = 0x218;
    lVar12 = 0xf8;
    goto LAB_00334658;
  case TYPE_ENUM:
    bVar1 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                      (input,(int *)&local_58);
    if (!bVar1) {
      return false;
    }
    iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
    if (*(int *)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x10) + 0x8c) == 3) {
      if (*(int *)(field + 0x4c) == 3) {
        (**(code **)(*plVar4 + 0x250))();
        return true;
      }
      (**(code **)(*plVar4 + 0x130))
                (plVar4,message,field,(ulong)local_58._M_dataplus._M_p & 0xffffffff);
      return true;
    }
    pEVar7 = FieldDescriptor::enum_type(field);
    pEVar8 = EnumDescriptor::FindValueByNumber(pEVar7,(int)local_58._M_dataplus._M_p);
    if (pEVar8 == (EnumValueDescriptor *)0x0) {
      pUVar5 = (UnknownFieldSet *)(**(code **)(*plVar4 + 0x18))(plVar4,message);
      UnknownFieldSet::AddVarint(pUVar5,tag >> 3,(long)(int)local_58._M_dataplus._M_p);
      return true;
    }
    if (*(int *)(field + 0x4c) == 3) {
      (**(code **)(*plVar4 + 0x248))();
      return true;
    }
    (**(code **)(*plVar4 + 0x128))(plVar4,message,field,pEVar8);
    return true;
  case TYPE_SFIXED32:
    bVar1 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                      (input,(int32 *)&local_58);
    goto LAB_00334463;
  case TYPE_SFIXED64:
    bVar1 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                      (input,(int64 *)&local_58);
    break;
  case TYPE_SINT32:
    bVar1 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                      (input,(int32 *)&local_58);
LAB_00334463:
    if (bVar1 == false) {
      return false;
    }
    bVar1 = *(int *)(field + 0x4c) == 3;
    uVar9 = (ulong)local_58._M_dataplus._M_p & 0xffffffff;
    lVar11 = *plVar4;
    lVar10 = 0x208;
    lVar12 = 0xe8;
LAB_00334658:
    if (bVar1) {
      lVar12 = lVar10;
    }
    (**(code **)(lVar11 + lVar12))(plVar4,message,field,uVar9);
    return true;
  case MAX_TYPE:
    bVar1 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                      (input,(int64 *)&local_58);
    break;
  default:
    goto LAB_00334b17;
  }
  if (bVar1 == false) {
    return false;
  }
  iVar2 = *(int *)(field + 0x4c);
  lVar11 = *plVar4;
  lVar10 = 0x210;
  lVar12 = 0xf0;
LAB_003345c6:
  if (iVar2 == 3) {
    lVar12 = lVar10;
  }
  (**(code **)(lVar11 + lVar12))(plVar4,message,field,local_58._M_dataplus._M_p);
LAB_00334b17:
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32 tag,
    const FieldDescriptor* field,        // May be NULL for unknown
    Message* message,
    io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == NULL) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
             WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32 length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        while (input->BytesUntilLimit() > 0) {                                 \
          CPPTYPE value;                                                       \
          if (!WireFormatLite::ReadPrimitive<                                  \
                CPPTYPE, WireFormatLite::TYPE_##TYPE>(input, &value))          \
            return false;                                                      \
          message_reflection->Add##CPPTYPE_METHOD(message, field, value);      \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PACKED_TYPE( INT32,  int32,  Int32)
      HANDLE_PACKED_TYPE( INT64,  int64,  Int64)
      HANDLE_PACKED_TYPE(SINT32,  int32,  Int32)
      HANDLE_PACKED_TYPE(SINT64,  int64,  Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64, UInt64)

      HANDLE_PACKED_TYPE( FIXED32, uint32, UInt32)
      HANDLE_PACKED_TYPE( FIXED64, uint64, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32,  int32,  Int32)
      HANDLE_PACKED_TYPE(SFIXED64,  int64,  Int64)

      HANDLE_PACKED_TYPE(FLOAT , float , Float )
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value)) return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != NULL) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64 sign_extended_value = static_cast<int64>(value);
              message_reflection->MutableUnknownFields(message)
                  ->AddVarint(
                      WireFormatLite::GetTagFieldNumber(tag),
                      sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
      case FieldDescriptor::TYPE_##TYPE: {                                    \
        CPPTYPE value;                                                        \
        if (!WireFormatLite::ReadPrimitive<                                   \
                CPPTYPE, WireFormatLite::TYPE_##TYPE>(input, &value))         \
          return false;                                                       \
        if (field->is_repeated()) {                                           \
          message_reflection->Add##CPPTYPE_METHOD(message, field, value);     \
        } else {                                                              \
          message_reflection->Set##CPPTYPE_METHOD(message, field, value);     \
        }                                                                     \
        break;                                                                \
      }

      HANDLE_TYPE( INT32,  int32,  Int32)
      HANDLE_TYPE( INT64,  int64,  Int64)
      HANDLE_TYPE(SINT32,  int32,  Int32)
      HANDLE_TYPE(SINT64,  int64,  Int64)
      HANDLE_TYPE(UINT32, uint32, UInt32)
      HANDLE_TYPE(UINT64, uint64, UInt64)

      HANDLE_TYPE( FIXED32, uint32, UInt32)
      HANDLE_TYPE( FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32,  int32,  Int32)
      HANDLE_TYPE(SFIXED64,  int64,  Int64)

      HANDLE_TYPE(FLOAT , float , Float )
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value)) return false;
        if (message->GetDescriptor()->file()->syntax() ==
            FileDescriptor::SYNTAX_PROTO3) {
          if (field->is_repeated()) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            message_reflection->SetEnumValue(message, field, value);
          }
        } else {
          const EnumValueDescriptor* enum_value =
              field->enum_type()->FindValueByNumber(value);
          if (enum_value != NULL) {
            if (field->is_repeated()) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              message_reflection->SetEnum(message, field, enum_value);
            }
          } else {
            // The enum value is not one of the known values.  Add it to the
            // UnknownFieldSet.
            int64 sign_extended_value = static_cast<int64>(value);
            message_reflection->MutableUnknownFields(message)
                              ->AddVarint(
                                  WireFormatLite::GetTagFieldNumber(tag),
                                  sign_extended_value);
          }
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(
                  value.data(), value.length(), WireFormatLite::PARSE,
                  field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}